

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.cpp
# Opt level: O0

int ncnn::reduction_post_process<ncnn::post_process_log<float>>(Mat *a,float coeff,Option *opt)

{
  int iVar1;
  int iVar2;
  float *pfVar3;
  float *pfVar4;
  Mat *in_RDI;
  float in_XMM0_Da;
  float fVar5;
  int i_3;
  float *outptr;
  int q;
  int i_2;
  int size_1;
  int c;
  int i_1;
  int size;
  int i;
  int w;
  int dims;
  post_process_log<float> mathop;
  float *in_stack_ffffffffffffff58;
  float in_stack_ffffffffffffff60;
  float in_stack_ffffffffffffff64;
  int local_94;
  int in_stack_ffffffffffffff84;
  Mat *in_stack_ffffffffffffff88;
  int local_40;
  int local_3c;
  int local_30;
  int local_28;
  
  iVar1 = in_RDI->dims;
  if (iVar1 == 1) {
    iVar1 = in_RDI->w;
    for (local_28 = 0; local_28 < iVar1; local_28 = local_28 + 1) {
      Mat::operator[](in_RDI,(long)local_28);
      fVar5 = post_process_log<float>::operator()
                        ((post_process_log<float> *)
                         CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                         in_stack_ffffffffffffff58);
      pfVar3 = Mat::operator[](in_RDI,(long)local_28);
      *pfVar3 = fVar5 * in_XMM0_Da;
    }
  }
  else if (iVar1 == 2) {
    iVar1 = in_RDI->w;
    iVar2 = in_RDI->h;
    for (local_30 = 0; local_30 < iVar1 * iVar2; local_30 = local_30 + 1) {
      Mat::operator[](in_RDI,(long)local_30);
      in_stack_ffffffffffffff64 =
           post_process_log<float>::operator()
                     ((post_process_log<float> *)
                      CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                      in_stack_ffffffffffffff58);
      in_stack_ffffffffffffff64 = in_stack_ffffffffffffff64 * in_XMM0_Da;
      pfVar3 = Mat::operator[](in_RDI,(long)local_30);
      *pfVar3 = in_stack_ffffffffffffff64;
    }
  }
  else if (iVar1 == 3) {
    iVar1 = in_RDI->c;
    iVar2 = in_RDI->w * in_RDI->h;
    if (iVar1 == 1) {
      for (local_3c = 0; local_3c < iVar2; local_3c = local_3c + 1) {
        Mat::operator[](in_RDI,(long)local_3c);
        in_stack_ffffffffffffff60 =
             post_process_log<float>::operator()
                       ((post_process_log<float> *)
                        CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                        in_stack_ffffffffffffff58);
        in_stack_ffffffffffffff60 = in_stack_ffffffffffffff60 * in_XMM0_Da;
        pfVar3 = Mat::operator[](in_RDI,(long)local_3c);
        *pfVar3 = in_stack_ffffffffffffff60;
      }
    }
    else {
      for (local_40 = 0; local_40 < iVar1; local_40 = local_40 + 1) {
        Mat::channel(in_stack_ffffffffffffff88,in_stack_ffffffffffffff84);
        pfVar4 = Mat::operator_cast_to_float_((Mat *)&stack0xffffffffffffff70);
        Mat::~Mat((Mat *)0x4e95e6);
        pfVar3 = pfVar4;
        for (local_94 = 0; local_94 < iVar2; local_94 = local_94 + 1) {
          fVar5 = post_process_log<float>::operator()
                            ((post_process_log<float> *)
                             CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),pfVar3);
          pfVar4[local_94] = fVar5 * in_XMM0_Da;
        }
      }
    }
  }
  return 0;
}

Assistant:

static int reduction_post_process(Mat& a, float coeff, const Option& opt)
{
    MathOp mathop;

    int dims = a.dims;
    if (dims == 1)
    {
        int w = a.w;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < w; i++)
            a[i] = mathop(a[i]) * coeff;
    }
    else if (dims == 2)
    {
        int size = a.w * a.h;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < size; i++)
            a[i] = mathop(a[i]) * coeff;
    }
    else if (dims == 3)
    {
        int c = a.c;
        int size = a.w * a.h;
        if (c == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < size; i++)
                a[i] = mathop(a[i]) * coeff;
        }
        else
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < c; q++)
            {
                float* outptr = a.channel(q);
                for (int i = 0; i < size; i++)
                    outptr[i] = mathop(outptr[i]) * coeff;
            }
        }
    }

    return 0;
}